

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

ImVector<unsigned_short> * __thiscall
ImVector<unsigned_short>::operator=(ImVector<unsigned_short> *this,ImVector<unsigned_short> *src)

{
  clear(this);
  resize(this,src->Size);
  if (src->Data != (unsigned_short *)0x0) {
    memcpy(this->Data,src->Data,(long)this->Size * 2);
  }
  return this;
}

Assistant:

inline ImVector<T>& operator=(const ImVector<T>& src)   { clear(); resize(src.Size); if (src.Data) memcpy(Data, src.Data, (size_t)Size * sizeof(T)); return *this; }